

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode AllowServerConnect(Curl_easy *data,_Bool *connected)

{
  timediff_t tVar1;
  uint local_44;
  CURLcode local_24;
  CURLcode result;
  timediff_t timeout_ms;
  _Bool *connected_local;
  Curl_easy *data_local;
  
  *connected = false;
  if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
     (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
    Curl_infof(data,"Preparing for accepting server on data port");
  }
  Curl_pgrsTime(data,TIMER_STARTACCEPT);
  tVar1 = ftp_timeleft_accept(data);
  if (tVar1 < 0) {
    Curl_failf(data,"Accept timeout occurred while waiting server connect");
    local_24 = CURLE_FTP_ACCEPT_TIMEOUT;
  }
  else {
    local_24 = ReceivedServerConnect(data,connected);
    if (local_24 == CURLE_OK) {
      if ((*connected & 1U) == 0) {
        if ((data->set).accepttimeout == 0) {
          local_44 = 60000;
        }
        else {
          local_44 = (data->set).accepttimeout;
        }
        Curl_expire(data,(ulong)local_44,EXPIRE_FTP_ACCEPT);
      }
      else {
        local_24 = AcceptServerConnect(data);
        if (local_24 == CURLE_OK) {
          local_24 = InitiateTransfer(data);
        }
      }
    }
  }
  if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
     ((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)) &&
      (0 < Curl_trc_feat_ftp.log_level)))) {
    Curl_trc_ftp(data,"AllowServerConnect() -> %d",(ulong)local_24);
  }
  return local_24;
}

Assistant:

static CURLcode AllowServerConnect(struct Curl_easy *data, bool *connected)
{
  timediff_t timeout_ms;
  CURLcode result = CURLE_OK;

  *connected = FALSE;
  infof(data, "Preparing for accepting server on data port");

  /* Save the time we start accepting server connect */
  Curl_pgrsTime(data, TIMER_STARTACCEPT);

  timeout_ms = ftp_timeleft_accept(data);
  if(timeout_ms < 0) {
    /* if a timeout was already reached, bail out */
    failf(data, "Accept timeout occurred while waiting server connect");
    result = CURLE_FTP_ACCEPT_TIMEOUT;
    goto out;
  }

  /* see if the connection request is already here */
  result = ReceivedServerConnect(data, connected);
  if(result)
    goto out;

  if(*connected) {
    result = AcceptServerConnect(data);
    if(result)
      goto out;

    result = InitiateTransfer(data);
    if(result)
      goto out;
  }
  else {
    /* Add timeout to multi handle and break out of the loop */
    Curl_expire(data, data->set.accepttimeout ?
                data->set.accepttimeout : DEFAULT_ACCEPT_TIMEOUT,
                EXPIRE_FTP_ACCEPT);
  }

out:
  CURL_TRC_FTP(data, "AllowServerConnect() -> %d", result);
  return result;
}